

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ether_common.c
# Opt level: O2

LispPTR check_sum(LispPTR *args)

{
  uint uVar1;
  DLword *pDVar2;
  LispPTR LVar3;
  uint uVar4;
  
  uVar4 = (uint)(ushort)args[2];
  pDVar2 = Lisp_world + *args;
  for (LVar3 = args[1]; 0xe0000 < (int)LVar3; LVar3 = LVar3 - 1) {
    uVar4 = uVar4 + *(ushort *)((ulong)pDVar2 ^ 2);
    uVar1 = (uVar4 & 0xffff) + 1;
    if (uVar4 < 0x10000) {
      uVar1 = uVar4;
    }
    uVar4 = uVar1 * 2 + 1 & 0xffff;
    if (uVar1 < 0x8000) {
      uVar4 = uVar1 * 2;
    }
    pDVar2 = pDVar2 + 1;
  }
  uVar1 = uVar4 | 0xe0000;
  if (uVar4 == 0xffff) {
    uVar1 = 0xe0000;
  }
  return uVar1;
}

Assistant:

LispPTR check_sum(LispPTR *args)
{
  LispPTR checksum;
  DLword *address;
  int nwords;

  address = (DLword *)NativeAligned2FromLAddr(*args++);
  nwords = *args++;

  if (*args != NIL)
    checksum = (*args) & MASKWORD1;
  else
    checksum = 0;

  for (; nwords > (S_POSITIVE); address++, nwords--) {
    checksum = checksum + GETWORD(address);
    if (checksum > 0xffff) checksum = (checksum & 0xffff) + 1; /* add carry */

    if (checksum > 0x7fff) /* ROTATE LEFT 1 */
      checksum = ((checksum & 0x7fff) << 1) | 1;
    else
      checksum = checksum << 1;
  }

  if (checksum == MASKWORD1)
    return (S_POSITIVE); /* ret 0 */
  else
    return (S_POSITIVE | checksum);

}